

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcCore.c
# Opt level: O3

void Bdc_ManPrepare(Bdc_Man_t *p,Vec_Ptr_t *vDivs)

{
  Bdc_Fun_t *pBVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  Bdc_Fun_t *pBVar5;
  long lVar6;
  uint *puVar7;
  ulong uVar8;
  
  Bdc_TableClear(p);
  pVVar3 = p->vMemory;
  iVar4 = 0;
  pVVar3->nSize = 0;
  p->nNodes = 0;
  if (vDivs != (Vec_Ptr_t *)0x0) {
    iVar4 = vDivs->nSize;
  }
  iVar4 = ~p->nVars - iVar4;
  p->nNodesNew = iVar4;
  if ((p->nNodesAlloc < 1) || (p->nNodesMax <= iVar4)) {
    pBVar5 = (Bdc_Fun_t *)0x0;
  }
  else {
    pBVar5 = p->pNodes;
    p->nNodes = 1;
    p->nNodesNew = iVar4 + 1;
    pBVar5->puFunc = (uint *)0x0;
    pBVar5->pNext = (Bdc_Fun_t *)0x0;
    pBVar5->pFan1 = (Bdc_Fun_t *)0x0;
    *(undefined8 *)&pBVar5->uSupp = 0;
    *(undefined8 *)pBVar5 = 0;
    pBVar5->pFan0 = (Bdc_Fun_t *)0x0;
    (pBVar5->field_6).pCopy = (void *)0x0;
    pVVar3 = p->vMemory;
  }
  pBVar5->Type = 1;
  uVar2 = p->nWords;
  if ((ulong)uVar2 != 0) {
    if ((int)uVar2 < 1) {
      __assert_fail("nWords > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x3a5,"unsigned int *Vec_IntFetch(Vec_Int_t *, int)");
    }
    lVar6 = (long)(int)uVar2 + (long)pVVar3->nSize;
    iVar4 = (int)lVar6;
    pVVar3->nSize = iVar4;
    if (iVar4 <= pVVar3->nCap) {
      puVar7 = (uint *)(pVVar3->pArray + (lVar6 - (ulong)uVar2));
      goto LAB_005ca653;
    }
  }
  puVar7 = (uint *)0x0;
LAB_005ca653:
  pBVar5->puFunc = puVar7;
  uVar2 = 1 << ((char)p->nVars - 5U & 0x1f);
  if (p->nVars < 6) {
    uVar2 = 1;
  }
  if (0 < (int)uVar2) {
    memset(puVar7,0xff,(ulong)uVar2 << 2);
  }
  pBVar5->uSupp = 0;
  Bdc_TableAdd(p,pBVar5);
  if (0 < p->nVars) {
    lVar6 = 0;
    do {
      iVar4 = p->nNodes;
      if ((iVar4 < p->nNodesAlloc) && (p->nNodesNew < p->nNodesMax)) {
        pBVar1 = p->pNodes;
        p->nNodes = iVar4 + 1;
        pBVar5 = pBVar1 + iVar4;
        p->nNodesNew = p->nNodesNew + 1;
        pBVar1[iVar4].puFunc = (uint *)0x0;
        (&pBVar1[iVar4].puFunc)[1] = (uint *)0x0;
        pBVar1[iVar4].pFan1 = (Bdc_Fun_t *)0x0;
        (&pBVar1[iVar4].pFan1)[1] = (Bdc_Fun_t *)0x0;
        *(undefined8 *)(pBVar1 + iVar4) = 0;
        pBVar1[iVar4].pFan0 = (Bdc_Fun_t *)0x0;
        pBVar1[iVar4].field_6.pCopy = (void *)0x0;
      }
      else {
        pBVar5 = (Bdc_Fun_t *)0x0;
      }
      pBVar5->Type = 2;
      if (p->vTruths->nSize <= lVar6) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pBVar5->puFunc = (uint *)p->vTruths->pArray[lVar6];
      pBVar5->uSupp = 1 << ((byte)lVar6 & 0x1f);
      Bdc_TableAdd(p,pBVar5);
      lVar6 = lVar6 + 1;
    } while (lVar6 < p->nVars);
  }
  if ((vDivs != (Vec_Ptr_t *)0x0) && (0 < vDivs->nSize)) {
    uVar8 = 0;
    do {
      puVar7 = (uint *)vDivs->pArray[uVar8];
      iVar4 = p->nNodes;
      if ((iVar4 < p->nNodesAlloc) && (p->nNodesNew < p->nNodesMax)) {
        pBVar1 = p->pNodes;
        p->nNodes = iVar4 + 1;
        pBVar5 = pBVar1 + iVar4;
        p->nNodesNew = p->nNodesNew + 1;
        pBVar1[iVar4].puFunc = (uint *)0x0;
        (&pBVar1[iVar4].puFunc)[1] = (uint *)0x0;
        pBVar1[iVar4].pFan1 = (Bdc_Fun_t *)0x0;
        (&pBVar1[iVar4].pFan1)[1] = (Bdc_Fun_t *)0x0;
        *(undefined8 *)(pBVar1 + iVar4) = 0;
        pBVar1[iVar4].pFan0 = (Bdc_Fun_t *)0x0;
        pBVar1[iVar4].field_6.pCopy = (void *)0x0;
      }
      else {
        pBVar5 = (Bdc_Fun_t *)0x0;
      }
      pBVar5->Type = 2;
      pBVar5->puFunc = puVar7;
      uVar2 = Kit_TruthSupport(puVar7,p->nVars);
      pBVar5->uSupp = uVar2;
      Bdc_TableAdd(p,pBVar5);
    } while ((uVar8 != (uint)p->nDivsLimit) && (uVar8 = uVar8 + 1, (long)uVar8 < (long)vDivs->nSize)
            );
  }
  if (p->nNodesNew == 0) {
    return;
  }
  __assert_fail("p->nNodesNew == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/bdc/bdcCore.c"
                ,0xb9,"void Bdc_ManPrepare(Bdc_Man_t *, Vec_Ptr_t *)");
}

Assistant:

void Bdc_ManPrepare( Bdc_Man_t * p, Vec_Ptr_t * vDivs )
{
    unsigned * puTruth;
    Bdc_Fun_t * pNode;
    int i;
    Bdc_TableClear( p );
    Vec_IntClear( p->vMemory );
    // add constant 1 and elementary vars
    p->nNodes = 0;
    p->nNodesNew = - 1 - p->nVars - (vDivs? Vec_PtrSize(vDivs) : 0);
    // add constant 1
    pNode = Bdc_FunNew( p );
    pNode->Type = BDC_TYPE_CONST1;
    pNode->puFunc = (unsigned *)Vec_IntFetch(p->vMemory, p->nWords); 
    Kit_TruthFill( pNode->puFunc, p->nVars );
    pNode->uSupp = 0;
    Bdc_TableAdd( p, pNode );
    // add variables
    for ( i = 0; i < p->nVars; i++ )
    {
        pNode = Bdc_FunNew( p );
        pNode->Type = BDC_TYPE_PI;
        pNode->puFunc = (unsigned *)Vec_PtrEntry( p->vTruths, i );
        pNode->uSupp = (1 << i);
        Bdc_TableAdd( p, pNode );
    }
    // add the divisors
    if ( vDivs )
    Vec_PtrForEachEntry( unsigned *, vDivs, puTruth, i )
    {
        pNode = Bdc_FunNew( p );
        pNode->Type = BDC_TYPE_PI;
        pNode->puFunc = puTruth;
        pNode->uSupp = Kit_TruthSupport( puTruth, p->nVars );
        Bdc_TableAdd( p, pNode );
        if ( i == p->nDivsLimit )
            break;
    }
    assert( p->nNodesNew == 0 );
}